

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O1

level_info_t * __thiscall
FMapInfoParser::ParseMapHeader(FMapInfoParser *this,level_info_t *defaultinfo)

{
  FString *this_00;
  byte *pbVar1;
  Node *pNVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  level_info_t *this_01;
  char *pcVar7;
  Node *pNVar8;
  char maptemp [8];
  char local_30 [8];
  
  bVar3 = FScanner::CheckNumber(&this->sc);
  if (bVar3) {
    mysnprintf(local_30,8,"MAP%02d",(ulong)(uint)(this->sc).Number);
    iVar4 = FName::NameManager::FindName(&FName::NameData,local_30,false);
    this->HexenHack = true;
  }
  else {
    FScanner::MustGetString(&this->sc);
    iVar4 = FName::NameManager::FindName(&FName::NameData,(this->sc).String,false);
  }
  uVar5 = FindWadLevelInfo(FName::NameData.NameArray[iVar4].Text);
  if (uVar5 == 0xffffffff) {
    uVar5 = TArray<level_info_t,_level_info_t>::Reserve(&wadlevelinfos,1);
  }
  this_01 = wadlevelinfos.Array + (int)uVar5;
  level_info_t::operator=(this_01,defaultinfo);
  if (this->HexenHack == true) {
    this_01->WallVertLight = '\0';
    this_01->WallHorizLight = '\0';
    this_01->flags = this_01->flags | 0x81801;
    this_01->flags2 = this_01->flags2 | 0x810110;
  }
  this_00 = &this_01->MapName;
  FString::operator=(this_00,FName::NameData.NameArray[iVar4].Text);
  FString::ToUpper(this_00);
  FScanner::MustGetString(&this->sc);
  pcVar7 = (this->sc).String;
  if (*pcVar7 == '$') {
    pbVar1 = (byte *)((long)&this_01->flags + 3);
    *pbVar1 = *pbVar1 | 4;
    pcVar7 = pcVar7 + 1;
  }
  else {
    bVar3 = FScanner::Compare(&this->sc,"lookup");
    if (bVar3) {
      FScanner::MustGetString(&this->sc);
      pbVar1 = (byte *)((long)&this_01->flags + 3);
      *pbVar1 = *pbVar1 | 4;
    }
    pcVar7 = (this->sc).String;
  }
  FString::operator=(&this_01->LevelName,pcVar7);
  pcVar7 = this_00->Chars;
  iVar4 = strncasecmp(pcVar7,"MAP",3);
  if ((iVar4 == 0) && (sVar6 = strlen(pcVar7), sVar6 < 6)) {
    uVar5 = atoi(pcVar7 + 3);
    if (0xffffff9c < uVar5 - 100) goto LAB_004b51fd;
  }
  else if ((*pcVar7 == 'E') &&
          ((((byte)(pcVar7[1] - 0x30U) < 10 && (pcVar7[2] == 'M')) &&
           ((byte)(pcVar7[3] - 0x30U) < 10)))) {
    uVar5 = ((uint)(byte)(pcVar7[3] - 0x30U) + pcVar7[1] * 10) - 0x1ea;
    goto LAB_004b51fd;
  }
  uVar5 = 0;
LAB_004b51fd:
  this_01->levelnum = uVar5;
  pNVar2 = HexenMusic.Nodes + (HexenMusic.Size - 1 & uVar5);
  while ((pNVar8 = pNVar2, pNVar8 != (Node *)0x0 && (pNVar8->Next != (Node *)0x1))) {
    pNVar2 = pNVar8->Next;
    if ((pNVar8->Pair).Key == uVar5) {
LAB_004b5232:
      if (pNVar8 != (Node *)0x0) {
        FString::operator=(&this_01->Music,&(pNVar8->Pair).Value);
      }
      return this_01;
    }
  }
  pNVar8 = (Node *)0x0;
  goto LAB_004b5232;
}

Assistant:

level_info_t *FMapInfoParser::ParseMapHeader(level_info_t &defaultinfo)
{
	FName mapname;

	if (sc.CheckNumber())
	{	// MAPNAME is a number; assume a Hexen wad
		char maptemp[8];
		mysnprintf (maptemp, countof(maptemp), "MAP%02d", sc.Number);
		mapname = maptemp;
		HexenHack = true;
	}
	else 
	{
		sc.MustGetString();
		mapname = sc.String;
	}
	int levelindex = FindWadLevelInfo (mapname);
	if (levelindex == -1)
	{
		levelindex = wadlevelinfos.Reserve(1);
	}
	level_info_t *levelinfo = &wadlevelinfos[levelindex];
	*levelinfo = defaultinfo;
	if (HexenHack)
	{
		levelinfo->WallHorizLight = levelinfo->WallVertLight = 0;

		// Hexen levels are automatically nointermission,
		// no auto sound sequences, falling damage,
		// monsters activate their own specials, and missiles
		// are always the activators of impact lines.
		levelinfo->flags |= LEVEL_NOINTERMISSION
						 | LEVEL_SNDSEQTOTALCTRL
						 | LEVEL_FALLDMG_HX
						 | LEVEL_ACTOWNSPECIAL;
		levelinfo->flags2|= LEVEL2_HEXENHACK
						 | LEVEL2_INFINITE_FLIGHT
						 | LEVEL2_MISSILESACTIVATEIMPACT
						 | LEVEL2_MONSTERFALLINGDAMAGE;

	}

	levelinfo->MapName = mapname;
	levelinfo->MapName.ToUpper();
	sc.MustGetString ();
	if (sc.String[0] == '$')
	{
		// For consistency with other definitions allow $Stringtablename here, too.
		levelinfo->flags |= LEVEL_LOOKUPLEVELNAME;
		levelinfo->LevelName = sc.String + 1;
	}
	else
	{
		if (sc.Compare ("lookup"))
		{
			sc.MustGetString ();
			levelinfo->flags |= LEVEL_LOOKUPLEVELNAME;
		}
		levelinfo->LevelName = sc.String;
	}

	// Set up levelnum now so that you can use Teleport_NewMap specials
	// to teleport to maps with standard names without needing a levelnum.
	levelinfo->levelnum = GetDefaultLevelNum(levelinfo->MapName);

	// Does this map have a song defined via SNDINFO's $map command?
	// Set that as this map's default music if it does.
	FString *song;
	if ((song = HexenMusic.CheckKey(levelinfo->levelnum)) != NULL)
	{
		levelinfo->Music = *song;
	}

	return levelinfo;
}